

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::SSDPRequester::OnTick(SSDPRequester *this)

{
  bool bVar1;
  uint64_t uVar2;
  OutputWorker *in_RDI;
  undefined1 uVar3;
  uint64_t nowUsec;
  Result result;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffc98;
  LogStringBuffer *in_stack_fffffffffffffca0;
  Result *in_stack_fffffffffffffcc8;
  undefined8 *puVar4;
  undefined7 in_stack_fffffffffffffcd8;
  string local_308 [8];
  SSDPRequester *in_stack_fffffffffffffd00;
  long local_2d8 [2];
  long *local_2c8;
  string *local_2c0;
  char *local_2b8;
  undefined8 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  ostream aoStack_258 [88];
  SSDPRequester *in_stack_fffffffffffffe00;
  SSDPRequester *in_stack_fffffffffffffed8;
  
  if (((ulong)in_RDI[5].Thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
      0x100000000) != 0) {
    *(undefined1 *)
     ((long)&in_RDI[5].Thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
     ) = 0;
    InitializeSockets(in_stack_fffffffffffffed8);
    local_2c8 = local_2d8;
    uVar3 = local_2d8[0] != 0;
    if ((bool)uVar3) {
      Result::ToJson_abi_cxx11_(in_stack_fffffffffffffcc8);
      local_2b0 = &ModuleLogger;
      local_2b8 = "Socket initialization failed: ";
      local_290 = &ModuleLogger;
      local_294 = 4;
      local_2a0 = "Socket initialization failed: ";
      local_280 = &ModuleLogger;
      local_284 = 4;
      local_2c0 = local_308;
      local_2a8 = local_308;
      if (DAT_002b61e8 < 5) {
        puVar4 = &ModuleLogger;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,Trace);
        std::operator<<(aoStack_258,(string *)(puVar4 + 7));
        std::operator<<(aoStack_258,"Socket initialization failed: ");
        std::operator<<(aoStack_258,local_308);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write
                  (in_RDI,(LogStringBuffer *)CONCAT17(uVar3,in_stack_fffffffffffffcd8));
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19bc5a);
      }
      std::__cxx11::string::~string(local_308);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    Result::~Result((Result *)in_stack_fffffffffffffca0);
    if (bVar1) {
      return;
    }
  }
  uVar2 = siamese::GetTimeUsec();
  if (5000000 < uVar2 - *(long *)&in_RDI->field_0x58) {
    uVar2 = siamese::GetTimeUsec();
    *(uint64_t *)&in_RDI->field_0x58 = uVar2;
    PollLANInfo(in_stack_fffffffffffffe00);
  }
  if (0 < *(int *)&in_RDI[5].Thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr) {
    *(int *)&in_RDI[5].Thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&in_RDI[5].Thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + -1;
    RequestSSDP(in_stack_fffffffffffffd00);
  }
  return;
}

Assistant:

void SSDPRequester::OnTick()
{
    // If initialization is needed:
    if (NeedsInitialization)
    {
        NeedsInitialization = false;

        // Attempt to initialize sockets
        Result result = InitializeSockets();

        // If attempt failed:
        if (result.IsFail())
        {
            ModuleLogger.Error("Socket initialization failed: ", result.ToJson());
            return;
        }
    }

    // If poll timer has expired:
    const uint64_t nowUsec = siamese::GetTimeUsec();
    if (nowUsec - LastLANInfoRequestUsec > protocol::kLANInfoIntervalUsec)
    {
        LastLANInfoRequestUsec = siamese::GetTimeUsec();

        // Check if LAN info changed
        PollLANInfo();
    }

    // If there are no multicasts requested:
    if (AttemptsRemaining <= 0) {
        return;
    }

    AttemptsRemaining--;

    // Request SSDP from gateway
    RequestSSDP();
}